

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonGroupInverse(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  char cVar6;
  bool bVar7;
  
  if ((ctx->pMem->flags & 0x2000) == 0) {
    pcVar3 = (char *)createAggContext(ctx,0);
  }
  else {
    pcVar3 = ctx->pMem->z;
  }
  if (pcVar3 != (char *)0x0) {
    lVar1 = *(long *)(pcVar3 + 8);
    cVar6 = *(char *)(lVar1 + 1);
    lVar5 = 1;
    if (cVar6 != ',') {
      bVar7 = false;
      lVar5 = 1;
      do {
        iVar4 = (int)lVar5;
        if (cVar6 == '\\') {
          iVar4 = iVar4 + 1;
        }
        else if (cVar6 == '\"') {
          bVar7 = (bool)(~bVar7 & 1);
        }
        cVar6 = *(char *)(lVar1 + 1 + (long)iVar4);
        lVar5 = (long)iVar4 + 1;
      } while ((cVar6 != ',') || (bVar7));
    }
    lVar2 = *(long *)(pcVar3 + 0x18);
    *(long *)(pcVar3 + 0x18) = lVar2 - lVar5;
    memmove((void *)(lVar1 + 1),(void *)(lVar1 + lVar5 + 1),(lVar2 - lVar5) - 1);
    return;
  }
  return;
}

Assistant:

static void jsonGroupInverse(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  int inStr = 0;
  char *z;
  JsonString *pStr;
  UNUSED_PARAM(argc);
  UNUSED_PARAM(argv);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, 0);
#ifdef NEVER
  /* pStr is always non-NULL since jsonArrayStep() or jsonObjectStep() will
  ** always have been called to initalize it */
  if( NEVER(!pStr) ) return;
#endif
  z = pStr->zBuf;
  for(i=1; z[i]!=',' || inStr; i++){
    assert( i<pStr->nUsed );
    if( z[i]=='"' ){
      inStr = !inStr;
    }else if( z[i]=='\\' ){
      i++;
    }
  }
  pStr->nUsed -= i;      
  memmove(&z[1], &z[i+1], (size_t)pStr->nUsed-1);
}